

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

void nowtech::log::
     Log<nowtech::log::QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>,_nowtech::log::SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>,_(signed_char)'\x02',_(nowtech::log::TaskRepresentation)2,_0UL,_444U>
     ::transmit(MessageQueue *aList)

{
  bool bVar1;
  char *pcVar2;
  type *ppcVar3;
  type *ppcVar4;
  Iterator __buf;
  int __flags;
  size_t __n;
  pair<char_*,_char_*> pVar5;
  MessageCompact<8UL,_true> *message;
  iterator __end0;
  iterator __begin0;
  MessageQueue *__range3;
  tConverter converter;
  type *end;
  type *begin;
  list<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>_>
  *in_stack_ffffffffffffff88;
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
  *this;
  int __fd;
  list<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>_>
  *in_stack_ffffffffffffff90;
  _Self local_50;
  _Self local_48 [2];
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
  *in_stack_ffffffffffffffc8;
  MessageCompact<8UL,_true> *in_stack_ffffffffffffffd0;
  
  pVar5 = SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>
          ::getBuffer();
  pcVar2 = pVar5.first;
  ppcVar3 = std::get<0ul,char*,char*>((pair<char_*,_char_*> *)0x109d28);
  ppcVar4 = std::get<1ul,char*,char*>((pair<char_*,_char_*> *)0x109d37);
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
  ::ConverterCustomText
            ((ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
              *)&stack0xffffffffffffffc8,*ppcVar3,*ppcVar4);
  local_48[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::Occupier>_>
       ::begin(in_stack_ffffffffffffff88);
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::Occupier>_>
       ::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator==(local_48,&local_50);
    __flags = (int)pcVar2;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::_List_iterator<nowtech::log::MessageCompact<8UL,_true>_>::operator*
              ((_List_iterator<nowtech::log::MessageCompact<8UL,_true>_> *)0x109d9f);
    MessageCompact<8ul,true>::
    output<nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8ul,true>,true,(unsigned_char)100,true,false>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::_List_iterator<nowtech::log::MessageCompact<8UL,_true>_>::operator++(local_48);
  }
  std::__cxx11::
  list<nowtech::log::MessageCompact<8UL,_true>,_nowtech::memory::PoolAllocator<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::Occupier>_>
  ::clear(in_stack_ffffffffffffff90);
  this = (ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
          *)&stack0xffffffffffffffc8;
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
  ::terminateSequence((ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
                       *)0x109dd7);
  __fd = (int)*ppcVar3;
  __buf = ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
          ::end(this);
  SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>
  ::send(__fd,__buf,__n,__flags);
  return;
}

Assistant:

static void transmit(MessageQueue &aList) noexcept {
    auto [begin, end] = tSender::getBuffer();
    tConverter converter(begin, end);
    for(auto &message : aList) {
      message.template output<tConverter>(converter);
    }
    aList.clear();
    converter.terminateSequence();
    tSender::send(begin, converter.end());
  }